

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void Object::clear_dead(void)

{
  Object *pOVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  vector<Object_*,_std::allocator<Object_*>_> temp;
  vector<Object_*,_std::allocator<Object_*>_> local_28;
  
  local_28.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Object **)0x0;
  local_28.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Object **)0x0;
  std::vector<Object_*,_std::allocator<Object_*>_>::reserve
            (&local_28,
             (long)obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  if (obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      pOVar1 = obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3];
      if (pOVar1->on_map == true) {
        if (local_28.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_28.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Object*,std::allocator<Object*>>::_M_realloc_insert<Object*const&>
                    ((vector<Object*,std::allocator<Object*>> *)&local_28,
                     (iterator)
                     local_28.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar3);
        }
        else {
          *local_28.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
           super__Vector_impl_data._M_finish = pOVar1;
          local_28.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_28.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        (*pOVar1->_vptr_Object[6])();
      }
      bVar2 = uVar4 < (ulong)((long)obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar2);
  }
  std::vector<Object_*,_std::allocator<Object_*>_>::operator=(&obj,&local_28);
  if (local_28.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Body::Body(const Point& p, PObject n){
	ch = CHR_BODY;
	position = p;
	next = n;
	obj.push_back(this);
	on_map = true;
}